

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_MapFieldFeaturesExplicitPresence_Test::
FeaturesTest_MapFieldFeaturesExplicitPresence_Test
          (FeaturesTest_MapFieldFeaturesExplicitPresence_Test *this)

{
  testing::Test::Test((Test *)this);
  (this->super_FeaturesTest).super_FeaturesBaseTest.super_Test._vptr_Test =
       (_func_int **)&PTR__ValidationErrorTest_018e2b28;
  DescriptorPool::DescriptorPool(&(this->super_FeaturesTest).super_FeaturesBaseTest.pool_);
  (this->super_FeaturesTest).super_FeaturesBaseTest.super_Test._vptr_Test =
       (_func_int **)&PTR__ValidationErrorTest_018dbfd8;
  return;
}

Assistant:

TEST_F(FeaturesTest, MapFieldFeaturesExplicitPresence) {
  BuildDescriptorMessagesInTestPool();
  const FileDescriptor* editions = ParseAndBuildFile("editions.proto", R"schema(
    edition = "2023";

    message Foo {
      map<string, Foo> message_map = 1;
      map<string, string> string_map = 2;
    }
  )schema");
  ASSERT_THAT(editions, NotNull());
  const FileDescriptor* proto2 = ParseAndBuildFile("google.protobuf.proto", R"schema(
    syntax = "proto2";

    message Bar {
      map<string, Bar> message_map = 1;
      map<string, string> string_map = 2;
    }
  )schema");
  ASSERT_THAT(proto2, NotNull());

  auto validate_maps = [](const FileDescriptor* file) {
    const FieldDescriptor* message_map = file->message_type(0)->field(0);
    EXPECT_FALSE(message_map->has_presence());
    EXPECT_TRUE(message_map->message_type()->field(0)->has_presence());
    EXPECT_TRUE(message_map->message_type()->field(1)->has_presence());

    const FieldDescriptor* string_map = file->message_type(0)->field(1);
    EXPECT_FALSE(string_map->has_presence());
    EXPECT_TRUE(string_map->message_type()->field(0)->has_presence());
    EXPECT_TRUE(string_map->message_type()->field(1)->has_presence());
  };
  validate_maps(editions);
  validate_maps(proto2);
}